

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::compute_update<false,false,true,false,true,0ul,1ul,2ul>(gd *g,example *ec)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  float fVar2;
  double dVar3;
  double dVar4;
  double eta_bar;
  double dev1;
  float update_scale;
  float pred_per_update;
  float update;
  vw *all;
  label_data *ld;
  example *in_stack_ffffffffffffffb8;
  gd *in_stack_ffffffffffffffc0;
  example *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  float local_24;
  
  plVar1 = *(long **)(in_RDI + 0x60);
  local_24 = 0.0;
  *(undefined4 *)(in_RSI + 0x68ac) = *(undefined4 *)(in_RSI + 0x6850);
  fVar2 = (float)(**(code **)(*(long *)plVar1[0x6a9] + 8))((long *)plVar1[0x6a9],*plVar1);
  if (0.0 < fVar2) {
    fVar2 = sensitivity<true,false,true,0ul,1ul,2ul,false>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    get_scale<0ul>((gd *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,(float)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    local_24 = (float)(**(code **)(*(long *)plVar1[0x6a9] + 0x18))();
    *(float *)(in_RSI + 0x68ac) = fVar2 * local_24 + *(float *)(in_RSI + 0x68ac);
    if (((int)plVar1[0x67] != 0) &&
       (dVar3 = std::fabs((double)(ulong)(uint)local_24), 1e-08 < SUB84(dVar3,0))) {
      fVar2 = (float)(**(code **)(*(long *)plVar1[0x6a9] + 0x30))((long *)plVar1[0x6a9],*plVar1);
      dVar3 = (double)fVar2;
      if (ABS(dVar3) <= 1e-08) {
        dVar4 = 0.0;
      }
      else {
        dVar4 = (double)-local_24 / dVar3;
      }
      if (1e-08 < ABS(dVar3)) {
        *(double *)(*plVar1 + 0x60) =
             (-(double)*(float *)((long)plVar1 + 0x32c) * dVar4 + 1.0) * *(double *)(*plVar1 + 0x60)
        ;
      }
      local_24 = local_24 / (float)*(double *)(*plVar1 + 0x60);
      *(double *)(*plVar1 + 0x58) =
           dVar4 * (double)*(float *)(plVar1 + 0x65) + *(double *)(*plVar1 + 0x58);
    }
  }
  return local_24;
}

Assistant:

float compute_update(gd& g, example& ec)
{
  // invariant: not a test label, importance weight > 0
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float update = 0.;
  ec.updated_prediction = ec.pred.scalar;
  if (all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) > 0.)
  {
    float pred_per_update = sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, false>(g, ec);
    float update_scale = get_scale<adaptive>(g, ec, ec.weight);
    if (invariant)
      update = all.loss->getUpdate(ec.pred.scalar, ld.label, update_scale, pred_per_update);
    else
      update = all.loss->getUnsafeUpdate(ec.pred.scalar, ld.label, update_scale);
    // changed from ec.partial_prediction to ld.prediction
    ec.updated_prediction += pred_per_update * update;

    if (all.reg_mode && fabs(update) > 1e-8)
    {
      double dev1 = all.loss->first_derivative(all.sd, ec.pred.scalar, ld.label);
      double eta_bar = (fabs(dev1) > 1e-8) ? (-update / dev1) : 0.0;
      if (fabs(dev1) > 1e-8)
        all.sd->contraction *= (1. - all.l2_lambda * eta_bar);
      update /= (float)all.sd->contraction;
      all.sd->gravity += eta_bar * all.l1_lambda;
    }
  }

  if (sparse_l2)
    update -= g.sparse_l2 * ec.pred.scalar;

  return update;
}